

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_freeAttributes__product
          (ColladaParserAutoGen15Private *this,void *attributeData)

{
  if (*(long *)((long)attributeData + 0xf8) != 0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject
              (&(this->
                super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                ).super_ParserTemplateBase.mStackMemoryManager);
  }
  if (*(long *)((long)attributeData + 0x208) != 0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject
              (&(this->
                super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                ).super_ParserTemplateBase.mStackMemoryManager);
  }
  product__AttributeData::~product__AttributeData((product__AttributeData *)attributeData);
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_freeAttributes__product( void* attributeData )
{
    product__AttributeData* typedAttributeData = static_cast<product__AttributeData*>(attributeData);
    if (typedAttributeData->_class.data)
    {
        mStackMemoryManager.deleteObject();
    }

    if (typedAttributeData->unknownAttributes.data)
    {
        mStackMemoryManager.deleteObject();
    }


    typedAttributeData->~product__AttributeData();

    return true;
}